

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog.c
# Opt level: O3

int xmlACatalogAdd(xmlCatalogPtr catal,xmlChar *type,xmlChar *orig,xmlChar *replace)

{
  _xmlCatalogEntry **pp_Var1;
  _xmlCatalogEntry *p_Var2;
  int iVar3;
  xmlCatalogEntryPtr pxVar4;
  xmlHashTablePtr hash;
  xmlCatalogEntryPtr pxVar5;
  void *pvVar6;
  xmlChar *pxVar7;
  _xmlCatalogEntry *p_Var8;
  xmlCatalogEntryType xVar9;
  bool bVar10;
  
  iVar3 = -1;
  if (catal != (xmlCatalogPtr)0x0) {
    if (catal->type == XML_XML_CATALOG_TYPE) {
      pxVar4 = catal->xml;
      if ((pxVar4 != (xmlCatalogEntryPtr)0x0) && ((uint)(pxVar4->type + XML_CATA_REMOVED) < 2)) {
        if (pxVar4->children == (_xmlCatalogEntry *)0x0) {
          xmlFetchXMLCatalogFile(pxVar4);
          bVar10 = pxVar4->children == (_xmlCatalogEntry *)0x0;
        }
        else {
          bVar10 = false;
        }
        iVar3 = xmlStrEqual(type,"system");
        xVar9 = XML_CATA_SYSTEM;
        if (iVar3 == 0) {
          iVar3 = xmlStrEqual(type,(xmlChar *)"public");
          xVar9 = XML_CATA_PUBLIC;
          if (iVar3 == 0) {
            iVar3 = xmlStrEqual(type,(xmlChar *)"rewriteSystem");
            xVar9 = XML_CATA_REWRITE_SYSTEM;
            if (iVar3 == 0) {
              iVar3 = xmlStrEqual(type,(xmlChar *)"delegatePublic");
              xVar9 = XML_CATA_DELEGATE_PUBLIC;
              if (iVar3 == 0) {
                iVar3 = xmlStrEqual(type,(xmlChar *)"delegateSystem");
                xVar9 = XML_CATA_DELEGATE_SYSTEM;
                if (iVar3 == 0) {
                  iVar3 = xmlStrEqual(type,"uri");
                  xVar9 = XML_CATA_URI;
                  if (iVar3 == 0) {
                    iVar3 = xmlStrEqual(type,(xmlChar *)"rewriteURI");
                    xVar9 = XML_CATA_REWRITE_URI;
                    if (iVar3 == 0) {
                      iVar3 = xmlStrEqual(type,(xmlChar *)"delegateURI");
                      xVar9 = XML_CATA_DELEGATE_URI;
                      if (iVar3 == 0) {
                        iVar3 = xmlStrEqual(type,(xmlChar *)"nextCatalog");
                        xVar9 = XML_CATA_NEXT_CATALOG;
                        if (iVar3 == 0) {
                          iVar3 = xmlStrEqual(type,"catalog");
                          xVar9 = XML_CATA_CATALOG;
                          if (iVar3 == 0) {
                            if (xmlDebugCatalogs == 0) {
                              return -1;
                            }
                            xmlCatalogPrintDebug
                                      ("Failed to add unknown element %s to catalog\n",type);
                            return -1;
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
        pp_Var1 = &pxVar4->children;
        p_Var2 = *pp_Var1;
        if (*pp_Var1 == (_xmlCatalogEntry *)0x0) {
          p_Var8 = (_xmlCatalogEntry *)0x0;
        }
        else {
          do {
            p_Var8 = p_Var2;
            if (((orig != (xmlChar *)0x0) && (p_Var8->type == xVar9)) &&
               (iVar3 = xmlStrEqual(orig,p_Var8->name), iVar3 != 0)) {
              if (xmlDebugCatalogs != 0) {
                xmlCatalogPrintDebug("Updating element %s to catalog\n",type);
              }
              if (p_Var8->value != (xmlChar *)0x0) {
                (*xmlFree)(p_Var8->value);
              }
              if (p_Var8->URL != (xmlChar *)0x0) {
                (*xmlFree)(p_Var8->URL);
              }
              pxVar7 = xmlStrdup(replace);
              p_Var8->value = pxVar7;
              pxVar7 = xmlStrdup(replace);
              p_Var8->URL = pxVar7;
              return 0;
            }
            p_Var2 = p_Var8->next;
          } while (p_Var8->next != (_xmlCatalogEntry *)0x0);
        }
        if (xmlDebugCatalogs != 0) {
          xmlCatalogPrintDebug("Adding element %s to catalog\n",type);
        }
        iVar3 = 0;
        pxVar5 = xmlNewCatalogEntry(xVar9,orig,replace,(xmlChar *)0x0,pxVar4->prefer,
                                    (xmlCatalogEntryPtr)0x0);
        if (p_Var8 == (_xmlCatalogEntry *)0x0) {
          p_Var8 = (_xmlCatalogEntry *)pp_Var1;
        }
        p_Var8->next = pxVar5;
        if (bVar10) {
          pxVar4->type = XML_CATA_CATALOG;
          pvVar6 = xmlHashLookup(xmlCatalogXMLFiles,pxVar4->URL);
          if (pvVar6 != (void *)0x0) {
            *(_xmlCatalogEntry **)((long)pvVar6 + 0x10) = *pp_Var1;
          }
        }
      }
    }
    else {
      iVar3 = xmlStrEqual(type,"SYSTEM");
      xVar9 = SGML_CATA_SYSTEM;
      if (iVar3 == 0) {
        iVar3 = xmlStrEqual(type,(xmlChar *)"PUBLIC");
        xVar9 = SGML_CATA_PUBLIC;
        if (iVar3 == 0) {
          iVar3 = xmlStrEqual(type,(xmlChar *)"DELEGATE");
          xVar9 = SGML_CATA_DELEGATE;
          if (iVar3 == 0) {
            iVar3 = xmlStrEqual(type,"ENTITY");
            xVar9 = SGML_CATA_ENTITY;
            if (iVar3 == 0) {
              iVar3 = xmlStrEqual(type,(xmlChar *)"DOCTYPE");
              xVar9 = SGML_CATA_DOCTYPE;
              if (iVar3 == 0) {
                iVar3 = xmlStrEqual(type,(xmlChar *)"LINKTYPE");
                xVar9 = SGML_CATA_LINKTYPE;
                if (iVar3 == 0) {
                  iVar3 = xmlStrEqual(type,(xmlChar *)"NOTATION");
                  xVar9 = SGML_CATA_NOTATION;
                  if (iVar3 == 0) {
                    iVar3 = xmlStrEqual(type,(xmlChar *)"SGMLDECL");
                    xVar9 = SGML_CATA_SGMLDECL;
                    if (iVar3 == 0) {
                      iVar3 = xmlStrEqual(type,(xmlChar *)"DOCUMENT");
                      xVar9 = SGML_CATA_DOCUMENT;
                      if (iVar3 == 0) {
                        iVar3 = xmlStrEqual(type,"CATALOG");
                        xVar9 = SGML_CATA_CATALOG;
                        if (iVar3 == 0) {
                          iVar3 = xmlStrEqual(type,(xmlChar *)"BASE");
                          xVar9 = SGML_CATA_BASE;
                          if (iVar3 == 0) {
                            return -1;
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      pxVar4 = xmlNewCatalogEntry(xVar9,orig,replace,(xmlChar *)0x0,XML_CATA_PREFER_NONE,
                                  (xmlCatalogEntryPtr)0x0);
      hash = catal->sgml;
      if (hash == (xmlHashTablePtr)0x0) {
        hash = xmlHashCreate(10);
        catal->sgml = hash;
      }
      iVar3 = xmlHashAddEntry(hash,orig,pxVar4);
      if (iVar3 < 0) {
        xmlFreeCatalogEntry(pxVar4,orig);
      }
    }
  }
  return iVar3;
}

Assistant:

int
xmlACatalogAdd(xmlCatalogPtr catal, const xmlChar * type,
              const xmlChar * orig, const xmlChar * replace)
{
    int res = -1;

    if (catal == NULL)
	return(-1);

    if (catal->type == XML_XML_CATALOG_TYPE) {
        res = xmlAddXMLCatalog(catal->xml, type, orig, replace);
    } else {
        xmlCatalogEntryType cattype;

        cattype = xmlGetSGMLCatalogEntryType(type);
        if (cattype != XML_CATA_NONE) {
            xmlCatalogEntryPtr entry;

            entry = xmlNewCatalogEntry(cattype, orig, replace, NULL,
                                       XML_CATA_PREFER_NONE, NULL);
	    if (catal->sgml == NULL)
		catal->sgml = xmlHashCreate(10);
            res = xmlHashAddEntry(catal->sgml, orig, entry);
            if (res < 0)
                xmlFreeCatalogEntry(entry, NULL);
        }
    }
    return (res);
}